

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O2

void __thiscall
cnn::GRUBuilder::GRUBuilder
          (GRUBuilder *this,uint layers,uint input_dim,uint hidden_dim,Model *model)

{
  Parameters *pPVar1;
  Parameters *pPVar2;
  Parameters *pPVar3;
  Parameters *pPVar4;
  Parameters *pPVar5;
  Parameters *pPVar6;
  Parameters *pPVar7;
  Parameters *pPVar8;
  bool bVar9;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<cnn::Parameters_*> __l;
  allocator_type local_d1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> ps;
  Parameters *local_78;
  Parameters *local_70;
  Parameters *local_68;
  Parameters *local_60;
  Parameters *local_58;
  Parameters *local_50;
  Parameters *local_48;
  Parameters *local_40;
  Parameters *local_38;
  
  (this->super_RNNBuilder).cur.t = -1;
  *(undefined8 *)&(this->super_RNNBuilder).sm = 0;
  *(undefined8 *)
   ((long)&(this->super_RNNBuilder).head.
           super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.
  super__Vector_base<cnn::RNNPointer,_std::allocator<cnn::RNNPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__GRUBuilder_003a4018;
  (this->params).
  super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->hidden_dim = hidden_dim;
  this->layers = layers;
  while (bVar9 = layers != 0, layers = layers - 1, bVar9) {
    x._M_len = 2;
    x._M_array = (iterator)
                 &ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = input_dim;
    Dim::Dim((Dim *)&local_78,x);
    pPVar1 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_00._M_len = 2;
    x_00._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_78,x_00);
    pPVar2 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_01._M_len = 1;
    x_01._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_78,x_01);
    pPVar3 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_02._M_len = 2;
    x_02._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = input_dim;
    Dim::Dim((Dim *)&local_78,x_02);
    pPVar4 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_03._M_len = 2;
    x_03._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_78,x_03);
    pPVar5 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_04._M_len = 1;
    x_04._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_78,x_04);
    pPVar6 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_05._M_len = 2;
    x_05._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = input_dim;
    Dim::Dim((Dim *)&local_78,x_05);
    pPVar7 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_06._M_len = 2;
    x_06._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_78,x_06);
    pPVar8 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    x_07._M_len = 1;
    x_07._M_array =
         (iterator)&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>;
    ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = hidden_dim;
    Dim::Dim((Dim *)&local_78,x_07);
    local_38 = Model::add_parameters(model,(Dim *)&local_78,0.0);
    __l._M_len = 9;
    __l._M_array = (iterator)&local_78;
    local_78 = pPVar1;
    local_70 = pPVar2;
    local_68 = pPVar3;
    local_60 = pPVar4;
    local_58 = pPVar5;
    local_50 = pPVar6;
    local_48 = pPVar7;
    local_40 = pPVar8;
    std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::vector
              ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
               &ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,__l,
               &local_d1);
    std::
    vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
    ::push_back(&this->params,
                (value_type *)
                &ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>);
    std::_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~_Vector_base
              (&ps.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>);
    input_dim = hidden_dim;
  }
  return;
}

Assistant:

GRUBuilder::GRUBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       Model* model) : hidden_dim(hidden_dim), layers(layers) {
  unsigned layer_input_dim = input_dim;
  for (unsigned i = 0; i < layers; ++i) {
    // z
    Parameters* p_x2z = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2z = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bz = model->add_parameters({hidden_dim});

    // r
    Parameters* p_x2r = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2r = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_br = model->add_parameters({hidden_dim});

    // h
    Parameters* p_x2h = model->add_parameters({hidden_dim, layer_input_dim});
    Parameters* p_h2h = model->add_parameters({hidden_dim, hidden_dim});
    Parameters* p_bh = model->add_parameters({hidden_dim});
    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameters*> ps = {p_x2z, p_h2z, p_bz, p_x2r, p_h2r, p_br, p_x2h, p_h2h, p_bh};
    params.push_back(ps);
  }  // layers
}